

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUCachePolicyULT.cpp
# Opt level: O3

void __thiscall
CTestGen12dGPUCachePolicy::CheckMocsIdxHDCL1
          (CTestGen12dGPUCachePolicy *this,uint32_t Usage,uint32_t AssignedMocsIdx,
          GMM_CACHE_POLICY_ELEMENT ClientRequest)

{
  bool bVar1;
  char *pcVar2;
  internal local_40 [8];
  AssertionResult gtest_ar;
  uint32_t AssignedMocsIdx_local;
  Message local_20;
  
  gtest_ar.message_.ptr_._4_4_ = AssignedMocsIdx;
  if (((undefined1  [40])ClientRequest & (undefined1  [40])0x40000) == (undefined1  [40])0x0) {
    if (AssignedMocsIdx < 0x3c) {
      local_20.ss_.ptr_._0_4_ = 0x30;
      testing::internal::CmpHelperLT<unsigned_int,int>
                (local_40,"AssignedMocsIdx","(48)",(uint *)((long)&gtest_ar.message_.ptr_ + 4),
                 (int *)&local_20);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message(&local_20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10),
                   "Usage# ",7);
        std::ostream::_M_insert<unsigned_long>
                  (CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10),
                   ": Incorrect Index for HDCL1 setting",0x23);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUCachePolicyULT.cpp"
                   ,0x81,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffd8,&local_20);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
        if (CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    local_20.ss_.ptr_._0_4_ = 0x30;
    testing::internal::CmpHelperGE<unsigned_int,int>
              (local_40,"AssignedMocsIdx","(48)",(uint *)((long)&gtest_ar.message_.ptr_ + 4),
               (int *)&local_20);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message(&local_20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10),
                 "Usage# ",7);
      std::ostream::_M_insert<unsigned_long>
                (CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10),
                 ": Index must be greater than ",0x1d);
      std::ostream::operator<<
                ((ostream *)(CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10),0x2f)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10),
                 " for HDCL1 setting. AssignedMocs: ",0x22);
      std::ostream::_M_insert<unsigned_long>
                (CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUCachePolicyULT.cpp"
                 ,0x7c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffd8,&local_20)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
      if (CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_20.ss_.ptr_._0_4_ = 0x3c;
    testing::internal::CmpHelperLT<unsigned_int,int>
              (local_40,"AssignedMocsIdx","(60)",(uint *)((long)&gtest_ar.message_.ptr_ + 4),
               (int *)&local_20);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message(&local_20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10),
                 "Usage# ",7);
      std::ostream::_M_insert<unsigned_long>
                (CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10),
                 ": Index must be less than ",0x1a);
      std::ostream::operator<<
                ((ostream *)(CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10),0x3c)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 0x10),
                 "for  HDCL1 setting",0x12);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUCachePolicyULT.cpp"
                 ,0x7d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffd8,&local_20)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
      if (CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_20.ss_.ptr_._4_4_,local_20.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

void CTestGen12dGPUCachePolicy::CheckMocsIdxHDCL1(uint32_t                    Usage,
                                                uint32_t                    AssignedMocsIdx,
                                                GMM_CACHE_POLICY_ELEMENT ClientRequest)
{
#define GMM_GEN12_MAX_NUMBER_MOCS_INDEXES (60) // On TGL last four (#60-#63) are reserved by h/w, few? are sw configurable though (#60)

    // Check of assigned Index setting is appropriate for HDCL1 setting
    if(ClientRequest.HDCL1)
    {
        EXPECT_GE(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Index must be greater than " << GMM_GEN10_HDCL1_MOCS_INDEX_START - 1 << " for HDCL1 setting. AssignedMocs: " << AssignedMocsIdx;
        EXPECT_LT(AssignedMocsIdx, GMM_GEN12_MAX_NUMBER_MOCS_INDEXES) << "Usage# " << Usage << ": Index must be less than " << GMM_GEN12_MAX_NUMBER_MOCS_INDEXES << "for  HDCL1 setting";
    }
    else if(AssignedMocsIdx < GMM_GEN12_MAX_NUMBER_MOCS_INDEXES)
    {
        EXPECT_LT(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
    }
}